

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

longlong ImGui::ScaleValueFromRatioT<long_long,long_long,double>
                   (ImGuiDataType data_type,float t,longlong v_min,longlong v_max,
                   bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  double dVar1;
  double __y;
  float fVar2;
  double dVar3;
  float fVar4;
  double dVar5;
  double local_18;
  
  if (v_max - v_min == 0) {
    return v_min;
  }
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      return (long)((float)(v_max - v_min) * t + (float)v_min);
    }
    if (1.0 <= t) {
      return v_max;
    }
    return v_min + (long)((double)((float)(v_max - v_min) * t) +
                         *(double *)(&DAT_0015eeb0 + (ulong)(v_max < v_min) * 8));
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  dVar5 = (double)v_min;
  local_18 = (double)logarithmic_zero_epsilon;
  if (ABS(dVar5) < local_18) {
    fVar4 = logarithmic_zero_epsilon;
    if (v_min < 0) {
      fVar4 = -logarithmic_zero_epsilon;
    }
    dVar5 = (double)fVar4;
  }
  dVar3 = (double)v_max;
  if (ABS(dVar3) < local_18) {
    fVar4 = -logarithmic_zero_epsilon;
    if (-1 < v_max) {
      fVar4 = logarithmic_zero_epsilon;
    }
    dVar3 = (double)fVar4;
  }
  dVar1 = dVar5;
  if (v_max < v_min) {
    t = 1.0 - t;
    dVar1 = dVar3;
    dVar3 = dVar5;
  }
  dVar5 = dVar3;
  if (v_max == 0) {
    dVar5 = (double)-logarithmic_zero_epsilon;
  }
  if (-1 < v_min) {
    dVar5 = dVar3;
  }
  if (v_max * v_min < 0) {
    fVar4 = (float)v_max;
    if (v_min < v_max) {
      v_max = v_min;
    }
    fVar2 = -(float)v_max / ABS(fVar4 - (float)v_min);
    fVar4 = zero_deadzone_halfsize + fVar2;
    if ((fVar2 - zero_deadzone_halfsize <= t) && (t <= fVar4)) {
      return 0;
    }
    if (t < fVar2) {
      dVar5 = pow(-dVar1 / local_18,(double)(1.0 - t / (fVar2 - zero_deadzone_halfsize)));
      dVar5 = -dVar5;
      goto LAB_0014c2ac;
    }
    dVar3 = dVar5 / local_18;
    __y = (double)((t - fVar4) / (1.0 - fVar4));
  }
  else if ((v_max | v_min) < 0) {
    dVar3 = dVar1 / dVar5;
    __y = (double)(1.0 - t);
    local_18 = dVar5;
  }
  else {
    dVar3 = dVar5 / dVar1;
    __y = (double)t;
    local_18 = dVar1;
  }
  dVar5 = pow(dVar3,__y);
LAB_0014c2ac:
  return (long)(dVar5 * local_18);
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}